

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

OrphanBuilder *
capnp::_::WireHelpers::disown
          (OrphanBuilder *__return_storage_ptr__,SegmentBuilder *segment,CapTableBuilder *capTable,
          WirePointer *ref)

{
  bool bVar1;
  Kind KVar2;
  word *refTarget;
  WirePointer *this;
  WirePointer *local_58;
  WirePointer *refCopy;
  Fault local_40;
  Fault f;
  word *pwStack_30;
  DebugExpression<bool> _kjCondition;
  word *location;
  WirePointer *ref_local;
  CapTableBuilder *capTable_local;
  SegmentBuilder *segment_local;
  OrphanBuilder *result;
  
  capTable_local = (CapTableBuilder *)segment;
  segment_local = (SegmentBuilder *)__return_storage_ptr__;
  bVar1 = WirePointer::isNull(ref);
  if (bVar1) {
    pwStack_30 = (word *)0x0;
  }
  else {
    KVar2 = WirePointer::kind(ref);
    if (KVar2 == OTHER) {
      f.exception._6_1_ = WirePointer::isCapability(ref);
      f.exception._7_1_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6))
      ;
      bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                        ((DebugExpression *)((long)&f.exception + 7));
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[22]>
                  (&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x85d,FAILED,"ref->isCapability()","_kjCondition,\"Unknown pointer type.\"",
                   (DebugExpression<bool> *)((long)&f.exception + 7),
                   (char (*) [22])"Unknown pointer type.");
        kj::_::Debug::Fault::~Fault(&local_40);
      }
      pwStack_30 = (word *)0x1;
    }
    else {
      local_58 = ref;
      refTarget = WirePointer::target(ref);
      pwStack_30 = followFarsNoWritableCheck(&local_58,refTarget,(SegmentBuilder **)&capTable_local)
      ;
    }
  }
  OrphanBuilder::OrphanBuilder
            (__return_storage_ptr__,ref,(SegmentBuilder *)capTable_local,capTable,pwStack_30);
  bVar1 = WirePointer::isNull(ref);
  if ((!bVar1) && (bVar1 = WirePointer::isPositional(ref), bVar1)) {
    this = OrphanBuilder::tagAsPtr(__return_storage_ptr__);
    KVar2 = WirePointer::kind(ref);
    WirePointer::setKindForOrphan(this,KVar2);
  }
  zeroMemory(ref);
  return __return_storage_ptr__;
}

Assistant:

static OrphanBuilder disown(SegmentBuilder* segment, CapTableBuilder* capTable,
                              WirePointer* ref) {
    word* location;

    if (ref->isNull()) {
      location = nullptr;
    } else if (ref->kind() == WirePointer::OTHER) {
      KJ_REQUIRE(ref->isCapability(), "Unknown pointer type.") { break; }
      location = reinterpret_cast<word*>(1);  // dummy so that it is non-null
    } else {
      WirePointer* refCopy = ref;
      location = followFarsNoWritableCheck(refCopy, ref->target(), segment);
    }

    OrphanBuilder result(ref, segment, capTable, location);

    if (!ref->isNull() && ref->isPositional()) {
      result.tagAsPtr()->setKindForOrphan(ref->kind());
    }

    // Zero out the pointer that was disowned.
    zeroMemory(ref);

    return result;
  }